

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestEventStream.cpp
# Opt level: O2

bool binlog::operator==(WriterProp *a,WriterProp *b)

{
  __type _Var1;
  bool bVar2;
  
  if (a->id == b->id) {
    _Var1 = std::operator==(&a->name,&b->name);
    if (_Var1) {
      bVar2 = a->batchSize == b->batchSize;
    }
    else {
      bVar2 = false;
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool operator==(const WriterProp& a, const WriterProp& b)
{
  return a.id == b.id
    &&   a.name == b.name
    &&   a.batchSize == b.batchSize;
}